

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_estimation.c
# Opt level: O0

_Bool aom_compute_global_motion
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,GlobalMotionMethod gm_method,int downsample_level,
                MotionModel *motion_models,int num_motion_models,_Bool *mem_alloc_failed)

{
  int in_R8D;
  MotionModel *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined4 in_stack_00000010;
  int in_stack_00000030;
  _Bool *in_stack_00000038;
  int in_stack_0000004c;
  YV12_BUFFER_CONFIG *in_stack_00000058;
  TransformationType in_stack_00000066;
  int in_stack_00000080;
  _Bool *in_stack_00000088;
  undefined1 local_1;
  
  if (in_R8D == 0) {
    local_1 = av1_compute_global_motion_feature_match
                        (in_stack_00000066,in_stack_00000058,(YV12_BUFFER_CONFIG *)mem_alloc_failed,
                         in_stack_0000004c,num_motion_models,motion_models,in_stack_00000080,
                         in_stack_00000088);
  }
  else if (in_R8D == 1) {
    local_1 = av1_compute_global_motion_disflow
                        (ref._6_1_,(YV12_BUFFER_CONFIG *)CONCAT44(bit_depth,gm_method),
                         (YV12_BUFFER_CONFIG *)CONCAT44(downsample_level,in_stack_00000010),
                         in_stack_0000000c,in_stack_00000008,unaff_retaddr,in_stack_00000030,
                         in_stack_00000038);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool aom_compute_global_motion(TransformationType type, YV12_BUFFER_CONFIG *src,
                               YV12_BUFFER_CONFIG *ref, int bit_depth,
                               GlobalMotionMethod gm_method,
                               int downsample_level, MotionModel *motion_models,
                               int num_motion_models, bool *mem_alloc_failed) {
  switch (gm_method) {
    case GLOBAL_MOTION_METHOD_FEATURE_MATCH:
      return av1_compute_global_motion_feature_match(
          type, src, ref, bit_depth, downsample_level, motion_models,
          num_motion_models, mem_alloc_failed);
    case GLOBAL_MOTION_METHOD_DISFLOW:
      return av1_compute_global_motion_disflow(
          type, src, ref, bit_depth, downsample_level, motion_models,
          num_motion_models, mem_alloc_failed);
    default: assert(0 && "Unknown global motion estimation type");
  }
  return false;
}